

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O3

int __thiscall
deqp::egl::SwapBuffersWithDamageTests::init(SwapBuffersWithDamageTests *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  EglTestContext *eglTestCtx;
  int extraout_EAX;
  SwapBuffersWithDamageTest *pSVar3;
  undefined8 *puVar4;
  allocator_type *__a;
  undefined8 *puVar5;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *extraout_RDX;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *extraout_RDX_00;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *extraout_RDX_01;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *extraout_RDX_02;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *extraout_RDX_03;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *extraout_RDX_04;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *extraout_RDX_05;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *extraout_RDX_06;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *frameDrawType;
  long lVar6;
  _anonymous_namespace_ *p_Var7;
  char *in_R9;
  long lVar8;
  _anonymous_namespace_ *this_00;
  string name;
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  frameDrawTypes;
  DrawType renderClear [2];
  DrawType clearRender [2];
  char *in_stack_ffffffffffffff38;
  string local_c0;
  int local_9c;
  TestCaseGroup *local_98;
  TestNode *local_90;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  local_68;
  _anonymous_namespace_ *local_50;
  DrawType local_48 [4];
  long local_38;
  
  local_48[2] = DRAWTYPE_GLES2_CLEAR;
  local_48[3] = DRAWTYPE_GLES2_RENDER;
  local_48[0] = DRAWTYPE_GLES2_RENDER;
  local_48[1] = DRAWTYPE_GLES2_CLEAR;
  local_68.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90 = (TestNode *)this;
  local_c0._M_dataplus._M_p = (pointer)operator_new(4);
  local_c0._M_string_length = (size_type)(local_c0._M_dataplus._M_p + 4);
  local_c0._M_dataplus._M_p[0] = '\0';
  local_c0._M_dataplus._M_p[1] = '\0';
  local_c0._M_dataplus._M_p[2] = '\0';
  local_c0._M_dataplus._M_p[3] = '\0';
  local_c0.field_2._M_allocated_capacity = local_c0._M_string_length;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::push_back(&local_68,(value_type *)&local_c0);
  if (local_c0._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_c0._M_dataplus._M_p,
                    local_c0.field_2._M_allocated_capacity - (long)local_c0._M_dataplus._M_p);
  }
  local_c0._M_dataplus._M_p = (pointer)operator_new(4);
  local_c0._M_string_length = (size_type)(local_c0._M_dataplus._M_p + 4);
  local_c0._M_dataplus._M_p[0] = '\x01';
  local_c0._M_dataplus._M_p[1] = '\0';
  local_c0._M_dataplus._M_p[2] = '\0';
  local_c0._M_dataplus._M_p[3] = '\0';
  local_c0.field_2._M_allocated_capacity = local_c0._M_string_length;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::push_back(&local_68,(value_type *)&local_c0);
  if (local_c0._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_c0._M_dataplus._M_p,
                    local_c0.field_2._M_allocated_capacity - (long)local_c0._M_dataplus._M_p);
  }
  local_c0._M_dataplus._M_p = (pointer)operator_new(8);
  local_c0._M_string_length = (size_type)(local_c0._M_dataplus._M_p + 8);
  local_c0._M_dataplus._M_p[0] = '\0';
  local_c0._M_dataplus._M_p[1] = '\0';
  local_c0._M_dataplus._M_p[2] = '\0';
  local_c0._M_dataplus._M_p[3] = '\0';
  local_c0._M_dataplus._M_p[4] = '\0';
  local_c0._M_dataplus._M_p[5] = '\0';
  local_c0._M_dataplus._M_p[6] = '\0';
  local_c0._M_dataplus._M_p[7] = '\0';
  local_c0.field_2._M_allocated_capacity = local_c0._M_string_length;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::push_back(&local_68,(value_type *)&local_c0);
  if (local_c0._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_c0._M_dataplus._M_p,
                    local_c0.field_2._M_allocated_capacity - (long)local_c0._M_dataplus._M_p);
  }
  local_c0._M_dataplus._M_p = (pointer)operator_new(8);
  __a = (allocator_type *)((long)local_c0._M_dataplus._M_p + 8);
  *(undefined1 **)local_c0._M_dataplus._M_p = &DAT_100000001;
  local_c0._M_string_length = (size_type)__a;
  local_c0.field_2._M_allocated_capacity = (size_type)__a;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::push_back(&local_68,(value_type *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_c0._M_dataplus._M_p,
                    local_c0.field_2._M_allocated_capacity - (long)local_c0._M_dataplus._M_p);
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::DrawType>>
  ::vector<deqp::egl::(anonymous_namespace)::DrawType_const*,void>
            ((vector<deqp::egl::(anonymous_namespace)::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::DrawType>>
              *)&local_c0,local_48 + 2,(DrawType *)&local_38,__a);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::push_back(&local_68,(value_type *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_c0._M_dataplus._M_p,
                    local_c0.field_2._M_allocated_capacity - (long)local_c0._M_dataplus._M_p);
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::DrawType>>
  ::vector<deqp::egl::(anonymous_namespace)::DrawType_const*,void>
            ((vector<deqp::egl::(anonymous_namespace)::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::DrawType>>
              *)&local_c0,local_48,local_48 + 2,__a);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::push_back(&local_68,(value_type *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_c0._M_dataplus._M_p,
                    local_c0.field_2._M_allocated_capacity - (long)local_c0._M_dataplus._M_p);
  }
  paVar1 = &local_c0.field_2;
  lVar6 = 0;
  do {
    iVar2 = (&DAT_01b942e0)[lVar6];
    local_38 = lVar6;
    local_98 = (TestCaseGroup *)operator_new(0x78);
    eglTestCtx = (EglTestContext *)local_90[1]._vptr_TestNode;
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    if (iVar2 == 2) {
      local_88._0_8_ = (allocator_type *)0x11;
      local_c0._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_c0,(ulong)local_88);
      *(undefined8 *)local_c0._M_dataplus._M_p = 0x615f657a69736572;
      builtin_strncpy((char *)((long)local_c0._M_dataplus._M_p + 8),"fter_swa",8);
      *(char *)((long)local_c0._M_dataplus._M_p + 0x10) = 'p';
LAB_00e32a77:
      local_c0._M_string_length = local_88._0_8_;
      local_c0._M_dataplus._M_p[local_88._0_8_] = '\0';
      local_c0.field_2._M_allocated_capacity = local_88._0_8_;
    }
    else {
      if (iVar2 == 1) {
        local_88._0_8_ = (allocator_type *)0x12;
        local_c0._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_c0,(ulong)local_88);
        *(undefined8 *)local_c0._M_dataplus._M_p = 0x625f657a69736572;
        builtin_strncpy((char *)((long)local_c0._M_dataplus._M_p + 8),"efore_sw",8);
        ((char *)((long)local_c0._M_dataplus._M_p + 0x10))[0] = 'a';
        ((char *)((long)local_c0._M_dataplus._M_p + 0x10))[1] = 'p';
        goto LAB_00e32a77;
      }
      if (iVar2 == 0) {
        local_c0.field_2._M_allocated_capacity = 0x7a697365725f6f6e;
        local_c0._M_string_length = 9;
        local_c0.field_2._8_2_ = 0x65;
      }
      else {
        local_c0._M_string_length = 0;
        local_c0.field_2._M_allocated_capacity =
             local_c0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      }
    }
    TestCaseGroup::TestCaseGroup
              (local_98,eglTestCtx,local_c0._M_dataplus._M_p,
               glcts::fixed_sample_locations_values + 1);
    frameDrawType = extraout_RDX;
    local_9c = iVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,(ulong)(local_c0.field_2._M_allocated_capacity + 1))
      ;
      frameDrawType = extraout_RDX_00;
    }
    this_00 = (_anonymous_namespace_ *)
              local_68.
              super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_50 = (_anonymous_namespace_ *)
               local_68.
               super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if ((long)local_68.
              super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_68.
              super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      lVar8 = ((long)local_68.
                     super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_68.
                     super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      lVar8 = lVar8 + (ulong)(lVar8 == 0);
      lVar6 = lVar8;
      p_Var7 = (_anonymous_namespace_ *)
               local_68.
               super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        egl::(anonymous_namespace)::generateTestName_abi_cxx11_(&local_c0,p_Var7,frameDrawType);
        pSVar3 = (SwapBuffersWithDamageTest *)operator_new(0x1af8);
        egl::anon_unknown_0::SwapBuffersWithDamageTest::SwapBuffersWithDamageTest
                  (pSVar3,(EglTestContext *)local_90[1]._vptr_TestNode,
                   (vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                    *)p_Var7,local_9c,(ResizeType)local_c0._M_dataplus._M_p,in_R9,
                   in_stack_ffffffffffffff38);
        tcu::TestNode::addChild((TestNode *)local_98,(TestNode *)pSVar3);
        frameDrawType = extraout_RDX_01;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._M_dataplus._M_p,
                          (ulong)(local_c0.field_2._M_allocated_capacity + 1));
          frameDrawType = extraout_RDX_02;
        }
        p_Var7 = p_Var7 + 0x18;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
      lVar6 = lVar8;
      p_Var7 = this_00;
      if (local_50 != this_00) {
        do {
          egl::(anonymous_namespace)::generateTestName_abi_cxx11_
                    ((string *)local_88,p_Var7,frameDrawType);
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)local_88,0,(char *)0x0,0x1b93f3c);
          puVar5 = puVar4 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar5) {
            local_c0.field_2._M_allocated_capacity = *puVar5;
            local_c0.field_2._8_8_ = puVar4[3];
            local_c0._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_c0.field_2._M_allocated_capacity = *puVar5;
            local_c0._M_dataplus._M_p = (pointer)*puVar4;
          }
          local_c0._M_string_length = puVar4[1];
          *puVar4 = puVar5;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          if ((allocator_type *)local_88._0_8_ != (allocator_type *)(local_88 + 0x10)) {
            operator_delete((void *)local_88._0_8_,local_78._M_allocated_capacity + 1);
          }
          pSVar3 = (SwapBuffersWithDamageTest *)operator_new(0x1af8);
          egl::anon_unknown_0::SwapBuffersWithDamageTest::SwapBuffersWithDamageTest
                    (pSVar3,(EglTestContext *)local_90[1]._vptr_TestNode,
                     (vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                      *)p_Var7,local_9c,(ResizeType)local_c0._M_dataplus._M_p,in_R9,
                     in_stack_ffffffffffffff38);
          (pSVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__SwapBuffersWithDamageTest_021105f0;
          tcu::TestNode::addChild((TestNode *)local_98,(TestNode *)pSVar3);
          frameDrawType = extraout_RDX_03;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != paVar1) {
            operator_delete(local_c0._M_dataplus._M_p,
                            (ulong)(local_c0.field_2._M_allocated_capacity + 1));
            frameDrawType = extraout_RDX_04;
          }
          p_Var7 = p_Var7 + 0x18;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
        if (local_50 != this_00) {
          do {
            egl::(anonymous_namespace)::generateTestName_abi_cxx11_
                      ((string *)local_88,this_00,frameDrawType);
            puVar4 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)local_88,0,(char *)0x0,0x1b93f4d);
            puVar5 = puVar4 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar4 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar5) {
              local_c0.field_2._M_allocated_capacity = *puVar5;
              local_c0.field_2._8_8_ = puVar4[3];
              local_c0._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_c0.field_2._M_allocated_capacity = *puVar5;
              local_c0._M_dataplus._M_p = (pointer)*puVar4;
            }
            local_c0._M_string_length = puVar4[1];
            *puVar4 = puVar5;
            puVar4[1] = 0;
            *(undefined1 *)(puVar4 + 2) = 0;
            if ((allocator_type *)local_88._0_8_ != (allocator_type *)(local_88 + 0x10)) {
              operator_delete((void *)local_88._0_8_,local_78._M_allocated_capacity + 1);
            }
            pSVar3 = (SwapBuffersWithDamageTest *)operator_new(0x1af8);
            egl::anon_unknown_0::SwapBuffersWithDamageTest::SwapBuffersWithDamageTest
                      (pSVar3,(EglTestContext *)local_90[1]._vptr_TestNode,
                       (vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                        *)this_00,local_9c,(ResizeType)local_c0._M_dataplus._M_p,in_R9,
                       in_stack_ffffffffffffff38);
            (pSVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__SwapBuffersWithDamageTest_02110650;
            tcu::TestNode::addChild((TestNode *)local_98,(TestNode *)pSVar3);
            frameDrawType = extraout_RDX_05;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != paVar1) {
              operator_delete(local_c0._M_dataplus._M_p,
                              (ulong)(local_c0.field_2._M_allocated_capacity + 1));
              frameDrawType = extraout_RDX_06;
            }
            this_00 = this_00 + 0x18;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
      }
    }
    tcu::TestNode::addChild(local_90,(TestNode *)local_98);
    lVar6 = local_38 + 1;
    if (lVar6 == 3) {
      std::
      vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
      ::~vector(&local_68);
      return extraout_EAX;
    }
  } while( true );
}

Assistant:

void SwapBuffersWithDamageTests::init (void)
{
	const DrawType clearRender[2] =
	{
		DRAWTYPE_GLES2_CLEAR,
		DRAWTYPE_GLES2_RENDER
	};

	const DrawType renderClear[2] =
	{
		DRAWTYPE_GLES2_RENDER,
		DRAWTYPE_GLES2_CLEAR
	};

	const ResizeType resizeTypes[] =
	{
		RESIZETYPE_NONE,
		RESIZETYPE_BEFORE_SWAP,
		RESIZETYPE_AFTER_SWAP
	};

	vector< vector<DrawType> > frameDrawTypes;
	frameDrawTypes.push_back(vector<DrawType> (1, DRAWTYPE_GLES2_CLEAR));
	frameDrawTypes.push_back(vector<DrawType> (1, DRAWTYPE_GLES2_RENDER));
	frameDrawTypes.push_back(vector<DrawType> (2, DRAWTYPE_GLES2_CLEAR));
	frameDrawTypes.push_back(vector<DrawType> (2, DRAWTYPE_GLES2_RENDER));
	frameDrawTypes.push_back(vector<DrawType> (DE_ARRAY_BEGIN(clearRender), DE_ARRAY_END(clearRender)));
	frameDrawTypes.push_back(vector<DrawType> (DE_ARRAY_BEGIN(renderClear), DE_ARRAY_END(renderClear)));

	for (size_t resizeTypeNdx = 0; resizeTypeNdx < DE_LENGTH_OF_ARRAY(resizeTypes); resizeTypeNdx++)
	{
		const ResizeType		resizeType	= resizeTypes[resizeTypeNdx];
		TestCaseGroup* const	resizeGroup	= new TestCaseGroup(m_eglTestCtx, generateResizeGroupName(resizeType).c_str(), "");

		for (size_t drawTypeNdx = 0; drawTypeNdx < frameDrawTypes.size(); drawTypeNdx++)
		{
			string name = generateTestName(frameDrawTypes[drawTypeNdx]);
			resizeGroup->addChild(new SwapBuffersWithDamageTest(m_eglTestCtx, frameDrawTypes[drawTypeNdx], 4, resizeType, name.c_str(), ""));
		}

		for (size_t drawTypeNdx = 0; drawTypeNdx < frameDrawTypes.size(); drawTypeNdx++)
		{
			string name = "preserve_buffer_" + generateTestName(frameDrawTypes[drawTypeNdx]);
			resizeGroup->addChild(new SwapBuffersWithDamageAndPreserveBufferTest(m_eglTestCtx, frameDrawTypes[drawTypeNdx], 4, resizeType, name.c_str(), ""));
		}

		for (size_t drawTypeNdx = 0; drawTypeNdx < frameDrawTypes.size(); drawTypeNdx++)
		{
			string name = "buffer_age_" + generateTestName(frameDrawTypes[drawTypeNdx]);
			resizeGroup->addChild(new SwapBuffersWithDamageAndBufferAgeTest(m_eglTestCtx, frameDrawTypes[drawTypeNdx], 4, resizeType, name.c_str(),  ""));
		}

		addChild(resizeGroup);
	}
}